

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

void __thiscall camp::ClassAlreadyCreated::~ClassAlreadyCreated(ClassAlreadyCreated *this)

{
  Error::~Error(&this->super_Error);
  operator_delete(this);
  return;
}

Assistant:

class CAMP_API ClassAlreadyCreated : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param name Name of the class
     * \param type Identifier of the C++ type
     */
    ClassAlreadyCreated(const std::string& name, const std::string& type);
}